

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_values.cpp
# Opt level: O3

double __thiscall ON_LengthValue::Length(ON_LengthValue *this,ON_UnitSystem *context_unit_system)

{
  LengthUnitSystem LVar1;
  double dVar2;
  double dVar3;
  
  LVar1 = ON_UnitSystem::UnitSystem(context_unit_system);
  dVar3 = ON_DBL_QNAN;
  if (LVar1 == None) {
LAB_005c0746:
    dVar3 = this->m_length;
  }
  else {
    dVar2 = ON_UnitSystem::MetersPerUnit(&this->m_length_unit_system,ON_DBL_QNAN);
    dVar3 = ON_UnitSystem::MetersPerUnit(context_unit_system,dVar3);
    if ((dVar2 == dVar3) && (!NAN(dVar2) && !NAN(dVar3))) {
      LVar1 = ON_UnitSystem::UnitSystem(context_unit_system);
      if (LVar1 != Unset) goto LAB_005c0746;
    }
    dVar2 = this->m_length;
    dVar3 = ON::UnitScale(&this->m_length_unit_system,context_unit_system);
    dVar3 = dVar3 * dVar2;
  }
  return dVar3;
}

Assistant:

double ON_LengthValue::Length(
  const ON_UnitSystem& context_unit_system
) const
{
  if ( ON::LengthUnitSystem::None == context_unit_system.UnitSystem())
    return m_length;
  if ( 
    m_length_unit_system.MetersPerUnit(ON_DBL_QNAN) == context_unit_system.MetersPerUnit(ON_DBL_QNAN)
    && ON::LengthUnitSystem::Unset != context_unit_system.UnitSystem() 
    )
    return m_length;
  return m_length*ON::UnitScale(m_length_unit_system, context_unit_system);
}